

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

bool Am_Connection::Register_Type
               (Am_Value_Type type,Am_Marshall_Method *marshall,Am_Unmarshall_Method *unmarshall,
               unsigned_long id)

{
  Am_Marshall_Method aItem;
  bool bVar1;
  _Base_ptr local_a0;
  Am_Value local_68 [2];
  undefined2 local_42;
  undefined1 local_40 [31];
  bool was_empty;
  unsigned_long id_local;
  Am_Unmarshall_Method *unmarshall_local;
  Am_Marshall_Method *marshall_local;
  Am_Value_Type type_local;
  
  local_40[0x17] = 1;
  id_local = (unsigned_long)unmarshall;
  unmarshall_local = (Am_Unmarshall_Method *)marshall;
  marshall_local._6_2_ = type;
  if (id == 0) {
    id_count = id_count + 1;
    unique0x10000195 = (_Base_ptr)id_count;
  }
  else {
    local_40._24_2_ = (undefined2)id;
    local_42 = local_40._24_2_;
    unique0x1000018d = (_Base_ptr)id;
    OpenAmulet::Map<unsigned_short,_Am_Value,_std::less<unsigned_short>_>::GetAt
              ((Map<unsigned_short,_Am_Value,_std::less<unsigned_short>_> *)local_40,
               (unsigned_short *)&Net_IDs);
    bVar1 = Am_Value::operator!=((Am_Value *)local_40,0);
    Am_Value::~Am_Value((Am_Value *)local_40);
    if (bVar1) {
      std::operator<<((ostream *)&std::cerr,"Declared duplicate type! Overwriting...");
      local_40[0x17] = 0;
    }
    if (id_count < stack0xffffffffffffffd8) {
      local_a0 = stack0xffffffffffffffd8;
    }
    else {
      local_a0 = (_Base_ptr)id_count;
    }
    id_count = (unsigned_long)local_a0;
  }
  Am_Value::Am_Value(local_68,(uint)marshall_local._6_2_);
  OpenAmulet::Map<Am_Value,_unsigned_short,_std::less<Am_Value>_>::SetAt
            (&Types,local_68,local_40._24_2_);
  Am_Value::~Am_Value(local_68);
  aItem.from_wrapper = unmarshall_local->from_wrapper;
  aItem.Call = (Am_Marshall_Method_Type *)unmarshall_local->Call;
  OpenAmulet::Map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>_>::SetAt
            (&Marshall_Methods,(unsigned_short)stack0xffffffffffffffd8,aItem);
  OpenAmulet::Map<unsigned_short,_Am_Unmarshall_Method,_std::less<unsigned_short>_>::SetAt
            (&Unmarshall_Methods,(unsigned_short)stack0xffffffffffffffd8,
             *(Am_Unmarshall_Method *)id_local);
  return (bool)(local_40[0x17] & 1);
}

Assistant:

bool
Am_Connection::Register_Type(Am_Value_Type type,
                             const Am_Marshall_Method &marshall,
                             const Am_Unmarshall_Method &unmarshall,
                             unsigned long id)
{
  bool was_empty = true;

  // Am_Network will generate an ID
  if (id == 0) {
    id = ++id_count;
  } else // The user provided an ID
  {
    // The id provided is already registered!
    if (Net_IDs.GetAt(id) != (0L)) {
      std::cerr << "Declared duplicate type! Overwriting...";
      was_empty = false;
    }

    id_count = (id > id_count ? id : id_count);
  }

  Types.SetAt(type, id);
  Marshall_Methods.SetAt(id, marshall);
  Unmarshall_Methods.SetAt(id, unmarshall);

  return (was_empty);
}